

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

void stbtt__sort_edges_quicksort(stbtt__edge *p,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  stbtt__edge *psVar14;
  stbtt__edge *psVar15;
  uint n_00;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  stbtt__edge *psVar20;
  stbtt__edge t;
  
  if (0xc < n) {
    do {
      psVar15 = p + ((uint)n >> 1);
      uVar18 = (ulong)(n - 1);
      uVar1 = vcmpps_avx512vl(ZEXT416((uint)psVar15->y0),ZEXT416((uint)p[uVar18].y0),1);
      uVar2 = vcmpps_avx512vl(ZEXT416((uint)p->y0),ZEXT416((uint)psVar15->y0),5);
      if ((((ushort)uVar2 ^ (ushort)uVar1) & 1) == 0) {
        uVar2 = vcmpps_avx512vl(ZEXT416((uint)p->y0),ZEXT416((uint)p[uVar18].y0),5);
        uVar11 = uVar18;
        if ((((ushort)uVar2 ^ (ushort)uVar1) & 1) != 0) {
          uVar11 = 0;
        }
        iVar16 = p[uVar11].invert;
        psVar20 = p + uVar11;
        fVar6 = psVar20->x0;
        fVar7 = psVar20->y0;
        fVar8 = psVar20->x1;
        fVar9 = psVar20->y1;
        p[uVar11].invert = psVar15->invert;
        fVar3 = psVar15->y0;
        fVar4 = psVar15->x1;
        fVar5 = psVar15->y1;
        psVar20 = p + uVar11;
        psVar20->x0 = psVar15->x0;
        psVar20->y0 = fVar3;
        psVar20->x1 = fVar4;
        psVar20->y1 = fVar5;
        psVar15->invert = iVar16;
        psVar15->x0 = fVar6;
        psVar15->y0 = fVar7;
        psVar15->x1 = fVar8;
        psVar15->y1 = fVar9;
      }
      iVar16 = p->invert;
      fVar6 = p->x0;
      fVar7 = p->y0;
      fVar8 = p->x1;
      fVar9 = p->y1;
      p->invert = psVar15->invert;
      fVar3 = psVar15->y0;
      fVar4 = psVar15->x1;
      fVar5 = psVar15->y1;
      p->x0 = psVar15->x0;
      p->y0 = fVar3;
      p->x1 = fVar4;
      p->y1 = fVar5;
      psVar15->invert = iVar16;
      psVar15->x0 = fVar6;
      psVar15->y0 = fVar7;
      psVar15->x1 = fVar8;
      psVar15->y1 = fVar9;
      iVar16 = n + 1;
      lVar12 = 1;
      while( true ) {
        iVar10 = (int)lVar12;
        n_00 = iVar16 - iVar10;
        lVar12 = (long)iVar10;
        lVar17 = (long)iVar10 * 0x14 + -0x14;
        do {
          lVar19 = lVar17;
          lVar13 = lVar12;
          lVar12 = lVar13 + 1;
          n_00 = n_00 - 1;
          lVar17 = lVar19 + 0x14;
        } while (*(float *)((long)&p[1].y0 + lVar19) < p->y0);
        psVar20 = (stbtt__edge *)((long)&p[1].x0 + lVar19);
        lVar17 = (long)(int)uVar18 + 1;
        psVar15 = p + (long)(int)uVar18 + 1;
        do {
          psVar14 = psVar15;
          lVar17 = lVar17 + -1;
          n = (int)uVar18;
          uVar18 = (ulong)(n - 1);
          psVar15 = psVar14 + -1;
        } while (p->y0 < psVar14[-1].y0);
        if (lVar17 <= lVar13) break;
        iVar10 = psVar20->invert;
        fVar6 = psVar20->x0;
        fVar7 = psVar20->y0;
        fVar8 = psVar20->x1;
        fVar9 = psVar20->y1;
        psVar20->invert = psVar14[-1].invert;
        fVar3 = psVar15->y0;
        fVar4 = psVar14[-1].x1;
        fVar5 = psVar14[-1].y1;
        psVar20->x0 = psVar15->x0;
        psVar20->y0 = fVar3;
        psVar20->x1 = fVar4;
        psVar20->y1 = fVar5;
        psVar14[-1].invert = iVar10;
        psVar15->x0 = fVar6;
        psVar15->y0 = fVar7;
        psVar14[-1].x1 = fVar8;
        psVar14[-1].y1 = fVar9;
      }
      if (n < (int)n_00) {
        stbtt__sort_edges_quicksort(p,n);
        p = psVar20;
        n = n_00;
      }
      else {
        stbtt__sort_edges_quicksort(psVar20,n_00);
      }
    } while (0xc < n);
  }
  return;
}

Assistant:

static void stbtt__sort_edges_quicksort(stbtt__edge *p, int n)
{
   /* threshold for transitioning to insertion sort */
   while (n > 12) {
      stbtt__edge t;
      int c01,c12,c,m,i,j;

      /* compute median of three */
      m = n >> 1;
      c01 = STBTT__COMPARE(&p[0],&p[m]);
      c12 = STBTT__COMPARE(&p[m],&p[n-1]);
      /* if 0 >= mid >= end, or 0 < mid < end, then use mid */
      if (c01 != c12) {
         /* otherwise, we'll need to swap something else to middle */
         int z;
         c = STBTT__COMPARE(&p[0],&p[n-1]);
         /* 0>mid && mid<n:  0>n => n; 0<n => 0 */
         /* 0<mid && mid>n:  0>n => 0; 0<n => n */
         z = (c == c12) ? 0 : n-1;
         t = p[z];
         p[z] = p[m];
         p[m] = t;
      }
      /* now p[m] is the median-of-three */
      /* swap it to the beginning so it won't move around */
      t = p[0];
      p[0] = p[m];
      p[m] = t;

      /* partition loop */
      i=1;
      j=n-1;
      for(;;) {
         /* handling of equality is crucial here */
         /* for sentinels & efficiency with duplicates */
         for (;;++i) {
            if (!STBTT__COMPARE(&p[i], &p[0])) break;
         }
         for (;;--j) {
            if (!STBTT__COMPARE(&p[0], &p[j])) break;
         }
         /* make sure we haven't crossed */
         if (i >= j) break;
         t = p[i];
         p[i] = p[j];
         p[j] = t;

         ++i;
         --j;
      }
      /* recurse on smaller side, iterate on larger */
      if (j < (n-i)) {
         stbtt__sort_edges_quicksort(p,j);
         p = p+i;
         n = n-i;
      } else {
         stbtt__sort_edges_quicksort(p+i, n-i);
         n = j;
      }
   }
}